

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_nbcd_8_pd7(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 local_14;
  uint res;
  uint dst;
  uint ea;
  
  address = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = address;
  uVar1 = m68ki_read_8_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar2 = (0x9a - uVar1) - (m68ki_cpu.x_flag >> 8 & 1);
  local_14 = uVar2 & 0xff;
  if (local_14 == 0x9a) {
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.x_flag = 0;
    local_14 = 0x9a;
  }
  else {
    uVar3 = local_14 ^ 0xffffffff;
    if ((uVar2 & 0xf) == 10) {
      local_14 = (uVar2 & 0xf0) + 0x10;
    }
    local_14 = local_14 & 0xff;
    m68ki_cpu.v_flag = local_14 & uVar3;
    m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,local_14);
    m68ki_cpu.not_z_flag = local_14 | m68ki_cpu.not_z_flag;
    m68ki_cpu.c_flag = 0x100;
    m68ki_cpu.x_flag = 0x100;
  }
  m68ki_cpu.n_flag = local_14;
  return;
}

Assistant:

static void m68k_op_nbcd_8_pd7(void)
{
	uint ea = EA_A7_PD_8();
	uint dst = m68ki_read_8(ea);
	uint res = MASK_OUT_ABOVE_8(0x9a - dst - XFLAG_AS_1());

	if(res != 0x9a)
	{
		FLAG_V = ~res; /* Undefined V behavior */

		if((res & 0x0f) == 0xa)
			res = (res & 0xf0) + 0x10;

		res = MASK_OUT_ABOVE_8(res);

		FLAG_V &= res; /* Undefined V behavior part II */

		m68ki_write_8(ea, MASK_OUT_ABOVE_8(res));

		FLAG_Z |= res;
		FLAG_C = CFLAG_SET;
		FLAG_X = XFLAG_SET;
	}
	else
	{
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		FLAG_X = XFLAG_CLEAR;
	}
	FLAG_N = NFLAG_8(res);	/* Undefined N behavior */
}